

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint __thiscall llvm::dwarf::getAttributeEncoding(dwarf *this,StringRef EncodingString)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar2 = 0;
  switch(EncodingString.Data) {
  case (char *)0xa:
    if (*(short *)(this + 8) == 0x4654 && *(long *)this == 0x555f4554415f5744) {
      uVar2 = 0x10;
    }
    else if (*(short *)(this + 8) == 0x5343 && *(long *)this == 0x555f4554415f5744) {
      uVar2 = 0x11;
    }
    break;
  case (char *)0xc:
    if (*(int *)(this + 8) == 0x74616f6c && *(long *)this == 0x665f4554415f5744) {
      uVar2 = 4;
    }
    else {
      uVar2 = 0x12;
      if (*(int *)(this + 8) != 0x49494353 || *(long *)this != 0x415f4554415f5744) {
        uVar2 = 0;
      }
    }
    break;
  case (char *)0xd:
    if (*(long *)(this + 5) == 0x64656e6769735f45 && *(long *)this == 0x735f4554415f5744) {
      uVar2 = 5;
    }
    else if (*(long *)(this + 5) == 0x6465746964655f45 && *(long *)this == 0x655f4554415f5744) {
      uVar2 = 0xc;
    }
    break;
  case (char *)0xe:
    if (*(long *)(this + 6) == 0x737365726464615f && *(long *)this == 0x615f4554415f5744) {
      uVar2 = 1;
    }
    else if (*(long *)(this + 6) == 0x6e61656c6f6f625f && *(long *)this == 0x625f4554415f5744) {
      uVar2 = 2;
    }
    break;
  case (char *)0xf:
    if (*(long *)(this + 7) == 0x64656e6769736e75 && *(long *)this == 0x755f4554415f5744) {
      uVar2 = 7;
    }
    break;
  case (char *)0x12:
    auVar3[0] = -(*this == (dwarf)'D');
    auVar3[1] = -(this[1] == (dwarf)'W');
    auVar3[2] = -(this[2] == (dwarf)'_');
    auVar3[3] = -(this[3] == (dwarf)'A');
    auVar3[4] = -(this[4] == (dwarf)'T');
    auVar3[5] = -(this[5] == (dwarf)'E');
    auVar3[6] = -(this[6] == (dwarf)'_');
    auVar3[7] = -(this[7] == (dwarf)'s');
    auVar3[8] = -(this[8] == (dwarf)'i');
    auVar3[9] = -(this[9] == (dwarf)'g');
    auVar3[10] = -(this[10] == (dwarf)'n');
    auVar3[0xb] = -(this[0xb] == (dwarf)'e');
    auVar3[0xc] = -(this[0xc] == (dwarf)'d');
    auVar3[0xd] = -(this[0xd] == (dwarf)'_');
    auVar3[0xe] = -(this[0xe] == (dwarf)'c');
    auVar3[0xf] = -(this[0xf] == (dwarf)'h');
    auVar12[0] = -((char)*(undefined2 *)(this + 0x10) == 'a');
    auVar12[1] = -((char)((ushort)*(undefined2 *)(this + 0x10) >> 8) == 'r');
    auVar12[2] = 0xff;
    auVar12[3] = 0xff;
    auVar12[4] = 0xff;
    auVar12[5] = 0xff;
    auVar12[6] = 0xff;
    auVar12[7] = 0xff;
    auVar12[8] = 0xff;
    auVar12[9] = 0xff;
    auVar12[10] = 0xff;
    auVar12[0xb] = 0xff;
    auVar12[0xc] = 0xff;
    auVar12[0xd] = 0xff;
    auVar12[0xe] = 0xff;
    auVar12[0xf] = 0xff;
    auVar12 = auVar12 & auVar3;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 6;
    }
    break;
  case (char *)0x13:
    auVar13[0] = -(this[3] == (dwarf)'A');
    auVar13[1] = -(this[4] == (dwarf)'T');
    auVar13[2] = -(this[5] == (dwarf)'E');
    auVar13[3] = -(this[6] == (dwarf)'_');
    auVar13[4] = -(this[7] == (dwarf)'s');
    auVar13[5] = -(this[8] == (dwarf)'i');
    auVar13[6] = -(this[9] == (dwarf)'g');
    auVar13[7] = -(this[10] == (dwarf)'n');
    auVar13[8] = -(this[0xb] == (dwarf)'e');
    auVar13[9] = -(this[0xc] == (dwarf)'d');
    auVar13[10] = -(this[0xd] == (dwarf)'_');
    auVar13[0xb] = -(this[0xe] == (dwarf)'f');
    auVar13[0xc] = -(this[0xf] == (dwarf)'i');
    auVar13[0xd] = -(this[0x10] == (dwarf)'x');
    auVar13[0xe] = -(this[0x11] == (dwarf)'e');
    auVar13[0xf] = -(this[0x12] == (dwarf)'d');
    auVar4[0] = -(*this == (dwarf)'D');
    auVar4[1] = -(this[1] == (dwarf)'W');
    auVar4[2] = -(this[2] == (dwarf)'_');
    auVar4[3] = -(this[3] == (dwarf)'A');
    auVar4[4] = -(this[4] == (dwarf)'T');
    auVar4[5] = -(this[5] == (dwarf)'E');
    auVar4[6] = -(this[6] == (dwarf)'_');
    auVar4[7] = -(this[7] == (dwarf)'s');
    auVar4[8] = -(this[8] == (dwarf)'i');
    auVar4[9] = -(this[9] == (dwarf)'g');
    auVar4[10] = -(this[10] == (dwarf)'n');
    auVar4[0xb] = -(this[0xb] == (dwarf)'e');
    auVar4[0xc] = -(this[0xc] == (dwarf)'d');
    auVar4[0xd] = -(this[0xd] == (dwarf)'_');
    auVar4[0xe] = -(this[0xe] == (dwarf)'f');
    auVar4[0xf] = -(this[0xf] == (dwarf)'i');
    auVar4 = auVar4 & auVar13;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 0xd;
    }
    break;
  case (char *)0x14:
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar14[0] = -((char)uVar1 == 'l');
    auVar14[1] = -((char)((uint)uVar1 >> 8) == 'o');
    auVar14[2] = -((char)((uint)uVar1 >> 0x10) == 'a');
    auVar14[3] = -((char)((uint)uVar1 >> 0x18) == 't');
    auVar14[4] = 0xff;
    auVar14[5] = 0xff;
    auVar14[6] = 0xff;
    auVar14[7] = 0xff;
    auVar14[8] = 0xff;
    auVar14[9] = 0xff;
    auVar14[10] = 0xff;
    auVar14[0xb] = 0xff;
    auVar14[0xc] = 0xff;
    auVar14[0xd] = 0xff;
    auVar14[0xe] = 0xff;
    auVar14[0xf] = 0xff;
    auVar5[0] = -(*this == (dwarf)'D');
    auVar5[1] = -(this[1] == (dwarf)'W');
    auVar5[2] = -(this[2] == (dwarf)'_');
    auVar5[3] = -(this[3] == (dwarf)'A');
    auVar5[4] = -(this[4] == (dwarf)'T');
    auVar5[5] = -(this[5] == (dwarf)'E');
    auVar5[6] = -(this[6] == (dwarf)'_');
    auVar5[7] = -(this[7] == (dwarf)'c');
    auVar5[8] = -(this[8] == (dwarf)'o');
    auVar5[9] = -(this[9] == (dwarf)'m');
    auVar5[10] = -(this[10] == (dwarf)'p');
    auVar5[0xb] = -(this[0xb] == (dwarf)'l');
    auVar5[0xc] = -(this[0xc] == (dwarf)'e');
    auVar5[0xd] = -(this[0xd] == (dwarf)'x');
    auVar5[0xe] = -(this[0xe] == (dwarf)'_');
    auVar5[0xf] = -(this[0xf] == (dwarf)'f');
    auVar5 = auVar5 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 3;
    }
    else {
      uVar1 = *(undefined4 *)(this + 0x10);
      auVar15[0] = -((char)uVar1 == 'c');
      auVar15[1] = -((char)((uint)uVar1 >> 8) == 'h');
      auVar15[2] = -((char)((uint)uVar1 >> 0x10) == 'a');
      auVar15[3] = -((char)((uint)uVar1 >> 0x18) == 'r');
      auVar15[4] = 0xff;
      auVar15[5] = 0xff;
      auVar15[6] = 0xff;
      auVar15[7] = 0xff;
      auVar15[8] = 0xff;
      auVar15[9] = 0xff;
      auVar15[10] = 0xff;
      auVar15[0xb] = 0xff;
      auVar15[0xc] = 0xff;
      auVar15[0xd] = 0xff;
      auVar15[0xe] = 0xff;
      auVar15[0xf] = 0xff;
      auVar6[0] = -(*this == (dwarf)'D');
      auVar6[1] = -(this[1] == (dwarf)'W');
      auVar6[2] = -(this[2] == (dwarf)'_');
      auVar6[3] = -(this[3] == (dwarf)'A');
      auVar6[4] = -(this[4] == (dwarf)'T');
      auVar6[5] = -(this[5] == (dwarf)'E');
      auVar6[6] = -(this[6] == (dwarf)'_');
      auVar6[7] = -(this[7] == (dwarf)'u');
      auVar6[8] = -(this[8] == (dwarf)'n');
      auVar6[9] = -(this[9] == (dwarf)'s');
      auVar6[10] = -(this[10] == (dwarf)'i');
      auVar6[0xb] = -(this[0xb] == (dwarf)'g');
      auVar6[0xc] = -(this[0xc] == (dwarf)'n');
      auVar6[0xd] = -(this[0xd] == (dwarf)'e');
      auVar6[0xe] = -(this[0xe] == (dwarf)'d');
      auVar6[0xf] = -(this[0xf] == (dwarf)'_');
      auVar6 = auVar6 & auVar15;
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 8;
      }
      else {
        uVar1 = *(undefined4 *)(this + 0x10);
        auVar16[0] = -((char)uVar1 == 'l');
        auVar16[1] = -((char)((uint)uVar1 >> 8) == 'o');
        auVar16[2] = -((char)((uint)uVar1 >> 0x10) == 'a');
        auVar16[3] = -((char)((uint)uVar1 >> 0x18) == 't');
        auVar16[4] = 0xff;
        auVar16[5] = 0xff;
        auVar16[6] = 0xff;
        auVar16[7] = 0xff;
        auVar16[8] = 0xff;
        auVar16[9] = 0xff;
        auVar16[10] = 0xff;
        auVar16[0xb] = 0xff;
        auVar16[0xc] = 0xff;
        auVar16[0xd] = 0xff;
        auVar16[0xe] = 0xff;
        auVar16[0xf] = 0xff;
        auVar7[0] = -(*this == (dwarf)'D');
        auVar7[1] = -(this[1] == (dwarf)'W');
        auVar7[2] = -(this[2] == (dwarf)'_');
        auVar7[3] = -(this[3] == (dwarf)'A');
        auVar7[4] = -(this[4] == (dwarf)'T');
        auVar7[5] = -(this[5] == (dwarf)'E');
        auVar7[6] = -(this[6] == (dwarf)'_');
        auVar7[7] = -(this[7] == (dwarf)'d');
        auVar7[8] = -(this[8] == (dwarf)'e');
        auVar7[9] = -(this[9] == (dwarf)'c');
        auVar7[10] = -(this[10] == (dwarf)'i');
        auVar7[0xb] = -(this[0xb] == (dwarf)'m');
        auVar7[0xc] = -(this[0xc] == (dwarf)'a');
        auVar7[0xd] = -(this[0xd] == (dwarf)'l');
        auVar7[0xe] = -(this[0xe] == (dwarf)'_');
        auVar7[0xf] = -(this[0xf] == (dwarf)'f');
        auVar7 = auVar7 & auVar16;
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
          uVar2 = 0xf;
        }
      }
    }
    break;
  case (char *)0x15:
    auVar18[0] = -(this[5] == (dwarf)'E');
    auVar18[1] = -(this[6] == (dwarf)'_');
    auVar18[2] = -(this[7] == (dwarf)'p');
    auVar18[3] = -(this[8] == (dwarf)'a');
    auVar18[4] = -(this[9] == (dwarf)'c');
    auVar18[5] = -(this[10] == (dwarf)'k');
    auVar18[6] = -(this[0xb] == (dwarf)'e');
    auVar18[7] = -(this[0xc] == (dwarf)'d');
    auVar18[8] = -(this[0xd] == (dwarf)'_');
    auVar18[9] = -(this[0xe] == (dwarf)'d');
    auVar18[10] = -(this[0xf] == (dwarf)'e');
    auVar18[0xb] = -(this[0x10] == (dwarf)'c');
    auVar18[0xc] = -(this[0x11] == (dwarf)'i');
    auVar18[0xd] = -(this[0x12] == (dwarf)'m');
    auVar18[0xe] = -(this[0x13] == (dwarf)'a');
    auVar18[0xf] = -(this[0x14] == (dwarf)'l');
    auVar9[0] = -(*this == (dwarf)'D');
    auVar9[1] = -(this[1] == (dwarf)'W');
    auVar9[2] = -(this[2] == (dwarf)'_');
    auVar9[3] = -(this[3] == (dwarf)'A');
    auVar9[4] = -(this[4] == (dwarf)'T');
    auVar9[5] = -(this[5] == (dwarf)'E');
    auVar9[6] = -(this[6] == (dwarf)'_');
    auVar9[7] = -(this[7] == (dwarf)'p');
    auVar9[8] = -(this[8] == (dwarf)'a');
    auVar9[9] = -(this[9] == (dwarf)'c');
    auVar9[10] = -(this[10] == (dwarf)'k');
    auVar9[0xb] = -(this[0xb] == (dwarf)'e');
    auVar9[0xc] = -(this[0xc] == (dwarf)'d');
    auVar9[0xd] = -(this[0xd] == (dwarf)'_');
    auVar9[0xe] = -(this[0xe] == (dwarf)'d');
    auVar9[0xf] = -(this[0xf] == (dwarf)'e');
    auVar9 = auVar9 & auVar18;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 10;
    }
    else {
      auVar19[0] = -(this[5] == (dwarf)'E');
      auVar19[1] = -(this[6] == (dwarf)'_');
      auVar19[2] = -(this[7] == (dwarf)'n');
      auVar19[3] = -(this[8] == (dwarf)'u');
      auVar19[4] = -(this[9] == (dwarf)'m');
      auVar19[5] = -(this[10] == (dwarf)'e');
      auVar19[6] = -(this[0xb] == (dwarf)'r');
      auVar19[7] = -(this[0xc] == (dwarf)'i');
      auVar19[8] = -(this[0xd] == (dwarf)'c');
      auVar19[9] = -(this[0xe] == (dwarf)'_');
      auVar19[10] = -(this[0xf] == (dwarf)'s');
      auVar19[0xb] = -(this[0x10] == (dwarf)'t');
      auVar19[0xc] = -(this[0x11] == (dwarf)'r');
      auVar19[0xd] = -(this[0x12] == (dwarf)'i');
      auVar19[0xe] = -(this[0x13] == (dwarf)'n');
      auVar19[0xf] = -(this[0x14] == (dwarf)'g');
      auVar10[0] = -(*this == (dwarf)'D');
      auVar10[1] = -(this[1] == (dwarf)'W');
      auVar10[2] = -(this[2] == (dwarf)'_');
      auVar10[3] = -(this[3] == (dwarf)'A');
      auVar10[4] = -(this[4] == (dwarf)'T');
      auVar10[5] = -(this[5] == (dwarf)'E');
      auVar10[6] = -(this[6] == (dwarf)'_');
      auVar10[7] = -(this[7] == (dwarf)'n');
      auVar10[8] = -(this[8] == (dwarf)'u');
      auVar10[9] = -(this[9] == (dwarf)'m');
      auVar10[10] = -(this[10] == (dwarf)'e');
      auVar10[0xb] = -(this[0xb] == (dwarf)'r');
      auVar10[0xc] = -(this[0xc] == (dwarf)'i');
      auVar10[0xd] = -(this[0xd] == (dwarf)'c');
      auVar10[0xe] = -(this[0xe] == (dwarf)'_');
      auVar10[0xf] = -(this[0xf] == (dwarf)'s');
      auVar10 = auVar10 & auVar19;
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        uVar2 = 0xb;
      }
      else {
        auVar20[0] = -(this[5] == (dwarf)'E');
        auVar20[1] = -(this[6] == (dwarf)'_');
        auVar20[2] = -(this[7] == (dwarf)'u');
        auVar20[3] = -(this[8] == (dwarf)'n');
        auVar20[4] = -(this[9] == (dwarf)'s');
        auVar20[5] = -(this[10] == (dwarf)'i');
        auVar20[6] = -(this[0xb] == (dwarf)'g');
        auVar20[7] = -(this[0xc] == (dwarf)'n');
        auVar20[8] = -(this[0xd] == (dwarf)'e');
        auVar20[9] = -(this[0xe] == (dwarf)'d');
        auVar20[10] = -(this[0xf] == (dwarf)'_');
        auVar20[0xb] = -(this[0x10] == (dwarf)'f');
        auVar20[0xc] = -(this[0x11] == (dwarf)'i');
        auVar20[0xd] = -(this[0x12] == (dwarf)'x');
        auVar20[0xe] = -(this[0x13] == (dwarf)'e');
        auVar20[0xf] = -(this[0x14] == (dwarf)'d');
        auVar11[0] = -(*this == (dwarf)'D');
        auVar11[1] = -(this[1] == (dwarf)'W');
        auVar11[2] = -(this[2] == (dwarf)'_');
        auVar11[3] = -(this[3] == (dwarf)'A');
        auVar11[4] = -(this[4] == (dwarf)'T');
        auVar11[5] = -(this[5] == (dwarf)'E');
        auVar11[6] = -(this[6] == (dwarf)'_');
        auVar11[7] = -(this[7] == (dwarf)'u');
        auVar11[8] = -(this[8] == (dwarf)'n');
        auVar11[9] = -(this[9] == (dwarf)'s');
        auVar11[10] = -(this[10] == (dwarf)'i');
        auVar11[0xb] = -(this[0xb] == (dwarf)'g');
        auVar11[0xc] = -(this[0xc] == (dwarf)'n');
        auVar11[0xd] = -(this[0xd] == (dwarf)'e');
        auVar11[0xe] = -(this[0xe] == (dwarf)'d');
        auVar11[0xf] = -(this[0xf] == (dwarf)'_');
        auVar11 = auVar11 & auVar20;
        if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
          uVar2 = 0xe;
        }
      }
    }
    break;
  case (char *)0x16:
    auVar17[0] = -(this[6] == (dwarf)'_');
    auVar17[1] = -(this[7] == (dwarf)'i');
    auVar17[2] = -(this[8] == (dwarf)'m');
    auVar17[3] = -(this[9] == (dwarf)'a');
    auVar17[4] = -(this[10] == (dwarf)'g');
    auVar17[5] = -(this[0xb] == (dwarf)'i');
    auVar17[6] = -(this[0xc] == (dwarf)'n');
    auVar17[7] = -(this[0xd] == (dwarf)'a');
    auVar17[8] = -(this[0xe] == (dwarf)'r');
    auVar17[9] = -(this[0xf] == (dwarf)'y');
    auVar17[10] = -(this[0x10] == (dwarf)'_');
    auVar17[0xb] = -(this[0x11] == (dwarf)'f');
    auVar17[0xc] = -(this[0x12] == (dwarf)'l');
    auVar17[0xd] = -(this[0x13] == (dwarf)'o');
    auVar17[0xe] = -(this[0x14] == (dwarf)'a');
    auVar17[0xf] = -(this[0x15] == (dwarf)'t');
    auVar8[0] = -(*this == (dwarf)'D');
    auVar8[1] = -(this[1] == (dwarf)'W');
    auVar8[2] = -(this[2] == (dwarf)'_');
    auVar8[3] = -(this[3] == (dwarf)'A');
    auVar8[4] = -(this[4] == (dwarf)'T');
    auVar8[5] = -(this[5] == (dwarf)'E');
    auVar8[6] = -(this[6] == (dwarf)'_');
    auVar8[7] = -(this[7] == (dwarf)'i');
    auVar8[8] = -(this[8] == (dwarf)'m');
    auVar8[9] = -(this[9] == (dwarf)'a');
    auVar8[10] = -(this[10] == (dwarf)'g');
    auVar8[0xb] = -(this[0xb] == (dwarf)'i');
    auVar8[0xc] = -(this[0xc] == (dwarf)'n');
    auVar8[0xd] = -(this[0xd] == (dwarf)'a');
    auVar8[0xe] = -(this[0xe] == (dwarf)'r');
    auVar8[0xf] = -(this[0xf] == (dwarf)'y');
    auVar8 = auVar8 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
      uVar2 = 9;
    }
  }
  return uVar2;
}

Assistant:

unsigned llvm::dwarf::getAttributeEncoding(StringRef EncodingString) {
  return StringSwitch<unsigned>(EncodingString)
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  .Case("DW_ATE_" #NAME, DW_ATE_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}